

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprBalance(Fts3Expr **pp,int nMaxDepth)

{
  u64 n;
  int iVar1;
  int iVar2;
  int iVar3;
  void *__s;
  Fts3Expr *pFVar4;
  long lVar5;
  Fts3Expr **ppFVar6;
  ulong uVar7;
  Fts3Expr *pFVar8;
  Fts3Expr *pFVar9;
  Fts3Expr *pFVar10;
  long in_FS_OFFSET;
  bool bVar11;
  Fts3Expr *pRight;
  Fts3Expr *pLeft;
  Fts3Expr *local_58;
  Fts3Expr *local_48;
  Fts3Expr *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = *pp;
  if (nMaxDepth == 0) {
    iVar3 = 1;
  }
  else {
    iVar1 = local_58->eType;
    if (1 < iVar1 - 3U) {
      if (iVar1 == 2) {
        local_40 = local_58->pLeft;
        pFVar8 = local_58->pRight;
        local_58->pLeft = (Fts3Expr *)0x0;
        local_58->pRight = (Fts3Expr *)0x0;
        local_40->pParent = (Fts3Expr *)0x0;
        pFVar8->pParent = (Fts3Expr *)0x0;
        local_48 = pFVar8;
        iVar3 = fts3ExprBalance(&local_40,nMaxDepth + -1);
        if ((iVar3 == 0) &&
           (iVar3 = fts3ExprBalance(&local_48,nMaxDepth + -1), pFVar8 = local_48, iVar3 == 0)) {
          local_58->pLeft = local_40;
          local_40->pParent = local_58;
          local_58->pRight = local_48;
          local_48->pParent = local_58;
          iVar3 = 0;
        }
        else {
          sqlite3Fts3ExprFree(pFVar8);
          sqlite3Fts3ExprFree(local_40);
        }
        goto LAB_001c95dd;
      }
      goto LAB_001c95ee;
    }
    iVar2 = sqlite3_initialize();
    iVar3 = 7;
    if (iVar2 == 0) {
      n = (long)nMaxDepth * 8;
      __s = sqlite3Malloc(n);
      if (__s != (void *)0x0) {
        memset(__s,0,n);
        iVar3 = local_58->eType;
        local_40 = local_58;
        while (iVar3 == iVar1) {
          local_40 = local_40->pLeft;
          iVar3 = local_40->eType;
        }
        pFVar8 = (Fts3Expr *)0x0;
        do {
          pFVar10 = local_40->pParent;
          local_40->pParent = (Fts3Expr *)0x0;
          if (pFVar10 == (Fts3Expr *)0x0) {
            local_58 = (Fts3Expr *)0x0;
          }
          else {
            pFVar10->pLeft = (Fts3Expr *)0x0;
          }
          iVar3 = fts3ExprBalance(&local_40,nMaxDepth + -1);
          if (iVar3 != 0) {
LAB_001c958b:
            if (0 < nMaxDepth) {
              uVar7 = 0;
              do {
                sqlite3Fts3ExprFree(*(Fts3Expr **)((long)__s + uVar7 * 8));
                uVar7 = uVar7 + 1;
              } while ((uint)nMaxDepth != uVar7);
            }
            while (pFVar8 != (Fts3Expr *)0x0) {
              pFVar10 = pFVar8->pParent;
              sqlite3_free(pFVar8);
              pFVar8 = pFVar10;
            }
            goto LAB_001c95d5;
          }
          bVar11 = local_40 != (Fts3Expr *)0x0;
          pFVar9 = local_40;
          if (bVar11 && 0 < nMaxDepth) {
            lVar5 = 0;
            pFVar4 = local_40;
            do {
              pFVar9 = pFVar8;
              pFVar8 = *(Fts3Expr **)((long)__s + lVar5 * 8);
              if (pFVar8 == (Fts3Expr *)0x0) {
                *(Fts3Expr **)((long)__s + lVar5 * 8) = pFVar4;
                pFVar8 = pFVar9;
                goto LAB_001c943e;
              }
              pFVar9->pLeft = pFVar8;
              pFVar9->pRight = pFVar4;
              pFVar8->pParent = pFVar9;
              pFVar4->pParent = pFVar9;
              pFVar8 = pFVar9->pParent;
              pFVar9->pParent = (Fts3Expr *)0x0;
              *(undefined8 *)((long)__s + lVar5 * 8) = 0;
              lVar5 = lVar5 + 1;
              pFVar4 = pFVar9;
            } while (lVar5 < nMaxDepth);
            bVar11 = pFVar9 != (Fts3Expr *)0x0;
          }
          if (bVar11) {
            sqlite3Fts3ExprFree(pFVar9);
            iVar3 = 0x12;
            goto LAB_001c958b;
          }
LAB_001c943e:
          if (pFVar10 == (Fts3Expr *)0x0) goto LAB_001c950f;
          ppFVar6 = &pFVar10->pRight;
          do {
            local_40 = *ppFVar6;
            ppFVar6 = &local_40->pLeft;
          } while (local_40->eType == iVar1);
          pFVar9 = pFVar10->pParent;
          pFVar4 = pFVar10->pRight;
          pFVar4->pParent = pFVar9;
          if (pFVar9 != (Fts3Expr *)0x0) {
            pFVar9->pLeft = pFVar4;
            pFVar4 = local_58;
          }
          local_58 = pFVar4;
          pFVar10->pParent = pFVar8;
          pFVar8 = pFVar10;
        } while( true );
      }
      iVar3 = 7;
    }
  }
  goto LAB_001c95e1;
LAB_001c950f:
  if (nMaxDepth < 1) {
    iVar3 = 0;
    local_58 = (Fts3Expr *)0x0;
  }
  else {
    uVar7 = 0;
    pFVar10 = (Fts3Expr *)0x0;
    do {
      pFVar9 = *(Fts3Expr **)((long)__s + uVar7 * 8);
      pFVar4 = pFVar8;
      local_58 = pFVar10;
      if (pFVar9 != (Fts3Expr *)0x0) {
        local_58 = pFVar9;
        if (pFVar10 != (Fts3Expr *)0x0) {
          pFVar8->pRight = pFVar10;
          pFVar9 = *(Fts3Expr **)((long)__s + uVar7 * 8);
          pFVar8->pLeft = pFVar9;
          pFVar9->pParent = pFVar8;
          pFVar10->pParent = pFVar8;
          pFVar4 = pFVar8->pParent;
          local_58 = pFVar8;
        }
        local_58->pParent = (Fts3Expr *)0x0;
      }
      uVar7 = uVar7 + 1;
      pFVar8 = pFVar4;
      pFVar10 = local_58;
    } while ((uint)nMaxDepth != uVar7);
    iVar3 = 0;
  }
LAB_001c95d5:
  sqlite3_free(__s);
LAB_001c95dd:
  if (iVar3 == 0) {
LAB_001c95ee:
    iVar3 = 0;
    goto LAB_001c95f0;
  }
LAB_001c95e1:
  sqlite3Fts3ExprFree(local_58);
  local_58 = (Fts3Expr *)0x0;
LAB_001c95f0:
  *pp = local_58;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3ExprBalance(Fts3Expr **pp, int nMaxDepth){
  int rc = SQLITE_OK;             /* Return code */
  Fts3Expr *pRoot = *pp;          /* Initial root node */
  Fts3Expr *pFree = 0;            /* List of free nodes. Linked by pParent. */
  int eType = pRoot->eType;       /* Type of node in this tree */

  if( nMaxDepth==0 ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_OK ){
    if( (eType==FTSQUERY_AND || eType==FTSQUERY_OR) ){
      Fts3Expr **apLeaf;
      apLeaf = (Fts3Expr **)sqlite3_malloc64(sizeof(Fts3Expr *) * nMaxDepth);
      if( 0==apLeaf ){
        rc = SQLITE_NOMEM;
      }else{
        memset(apLeaf, 0, sizeof(Fts3Expr *) * nMaxDepth);
      }

      if( rc==SQLITE_OK ){
        int i;
        Fts3Expr *p;

        /* Set $p to point to the left-most leaf in the tree of eType nodes. */
        for(p=pRoot; p->eType==eType; p=p->pLeft){
          assert( p->pParent==0 || p->pParent->pLeft==p );
          assert( p->pLeft && p->pRight );
        }

        /* This loop runs once for each leaf in the tree of eType nodes. */
        while( 1 ){
          int iLvl;
          Fts3Expr *pParent = p->pParent;     /* Current parent of p */

          assert( pParent==0 || pParent->pLeft==p );
          p->pParent = 0;
          if( pParent ){
            pParent->pLeft = 0;
          }else{
            pRoot = 0;
          }
          rc = fts3ExprBalance(&p, nMaxDepth-1);
          if( rc!=SQLITE_OK ) break;

          for(iLvl=0; p && iLvl<nMaxDepth; iLvl++){
            if( apLeaf[iLvl]==0 ){
              apLeaf[iLvl] = p;
              p = 0;
            }else{
              assert( pFree );
              pFree->pLeft = apLeaf[iLvl];
              pFree->pRight = p;
              pFree->pLeft->pParent = pFree;
              pFree->pRight->pParent = pFree;

              p = pFree;
              pFree = pFree->pParent;
              p->pParent = 0;
              apLeaf[iLvl] = 0;
            }
          }
          if( p ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_TOOBIG;
            break;
          }

          /* If that was the last leaf node, break out of the loop */
          if( pParent==0 ) break;

          /* Set $p to point to the next leaf in the tree of eType nodes */
          for(p=pParent->pRight; p->eType==eType; p=p->pLeft);

          /* Remove pParent from the original tree. */
          assert( pParent->pParent==0 || pParent->pParent->pLeft==pParent );
          pParent->pRight->pParent = pParent->pParent;
          if( pParent->pParent ){
            pParent->pParent->pLeft = pParent->pRight;
          }else{
            assert( pParent==pRoot );
            pRoot = pParent->pRight;
          }

          /* Link pParent into the free node list. It will be used as an
          ** internal node of the new tree.  */
          pParent->pParent = pFree;
          pFree = pParent;
        }

        if( rc==SQLITE_OK ){
          p = 0;
          for(i=0; i<nMaxDepth; i++){
            if( apLeaf[i] ){
              if( p==0 ){
                p = apLeaf[i];
                p->pParent = 0;
              }else{
                assert( pFree!=0 );
                pFree->pRight = p;
                pFree->pLeft = apLeaf[i];
                pFree->pLeft->pParent = pFree;
                pFree->pRight->pParent = pFree;

                p = pFree;
                pFree = pFree->pParent;
                p->pParent = 0;
              }
            }
          }
          pRoot = p;
        }else{
          /* An error occurred. Delete the contents of the apLeaf[] array
          ** and pFree list. Everything else is cleaned up by the call to
          ** sqlite3Fts3ExprFree(pRoot) below.  */
          Fts3Expr *pDel;
          for(i=0; i<nMaxDepth; i++){
            sqlite3Fts3ExprFree(apLeaf[i]);
          }
          while( (pDel=pFree)!=0 ){
            pFree = pDel->pParent;
            sqlite3_free(pDel);
          }
        }

        assert( pFree==0 );
        sqlite3_free( apLeaf );
      }
    }else if( eType==FTSQUERY_NOT ){
      Fts3Expr *pLeft = pRoot->pLeft;
      Fts3Expr *pRight = pRoot->pRight;

      pRoot->pLeft = 0;
      pRoot->pRight = 0;
      pLeft->pParent = 0;
      pRight->pParent = 0;

      rc = fts3ExprBalance(&pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprBalance(&pRight, nMaxDepth-1);
      }

      if( rc!=SQLITE_OK ){
        sqlite3Fts3ExprFree(pRight);
        sqlite3Fts3ExprFree(pLeft);
      }else{
        assert( pLeft && pRight );
        pRoot->pLeft = pLeft;
        pLeft->pParent = pRoot;
        pRoot->pRight = pRight;
        pRight->pParent = pRoot;
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRoot);
    pRoot = 0;
  }
  *pp = pRoot;
  return rc;
}